

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int UTF8ToLatin1(uchar *out,int *outlen,uchar *in,int *inlen,void *vctxt)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  byte *pbVar7;
  int iVar8;
  
  iVar4 = (int)in;
  iVar2 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && out != (uchar *)0x0)) {
    if (in != (uchar *)0x0) {
      pbVar7 = out;
      if (0 < (long)*inlen) {
        pbVar3 = in + *inlen;
        iVar2 = *outlen;
        lVar6 = 0;
        do {
          pbVar7 = out + lVar6;
          if (out + iVar2 <= pbVar7) {
            iVar2 = -3;
LAB_0012d8ad:
            iVar8 = (int)lVar6;
            goto LAB_0012d8b0;
          }
          bVar5 = *in;
          if ((char)bVar5 < '\0') {
            if ((bVar5 & 0xfe) != 0xc2) {
              iVar2 = -2;
              goto LAB_0012d8ad;
            }
            if ((long)pbVar3 - (long)in < 2) goto LAB_0012d892;
            pbVar1 = in + 1;
            in = in + 1;
            bVar5 = bVar5 << 6 | *pbVar1 & 0x3f;
          }
          *pbVar7 = bVar5;
          in = in + 1;
          lVar6 = lVar6 + 1;
        } while (in < pbVar3);
        pbVar7 = out + lVar6;
      }
LAB_0012d892:
      iVar8 = (int)pbVar7 - (int)out;
      iVar2 = iVar8;
LAB_0012d8b0:
      *outlen = iVar8;
      *inlen = (int)in - iVar4;
      return iVar2;
    }
    iVar2 = 0;
    *inlen = 0;
    *outlen = 0;
  }
  return iVar2;
}

Assistant:

static int
UTF8ToLatin1(unsigned char* out, int *outlen,
             const unsigned char* in, int *inlen,
             void *vctxt ATTRIBUTE_UNUSED) {
    const unsigned char* outend;
    const unsigned char* outstart = out;
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned c;
    int ret = XML_ENC_ERR_SPACE;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL))
        return(XML_ENC_ERR_INTERNAL);

    if (in == NULL) {
        *inlen = 0;
        *outlen = 0;
        return(XML_ENC_ERR_SUCCESS);
    }

    inend = in + *inlen;
    outend = out + *outlen;
    while (in < inend) {
        if (out >= outend)
            goto done;

	c = *in;

        if (c < 0x80) {
            *out++ = c;
        } else if ((c >= 0xC2) && (c <= 0xC3)) {
            if (inend - in < 2)
                break;
            in++;
            *out++ = (unsigned char) ((c << 6) | (*in & 0x3F));
        } else {
            ret = XML_ENC_ERR_INPUT;
            goto done;
	}

        in++;
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}